

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase785::run(TestCase785 *this)

{
  int __fd;
  char cVar1;
  undefined4 uVar2;
  Directory *pDVar3;
  int osErrorNumber;
  InMemoryFileFactory *fileFactory;
  ArrayPtr<const_kj::StringPtr> parts;
  PathPtr path;
  ArrayPtr<const_kj::StringPtr> parts_00;
  PathPtr path_00;
  StringPtr text;
  Fault f;
  char *local_100;
  bool local_f0;
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_4;
  Array<kj::String> local_b8;
  char *local_90;
  Own<const_kj::ReadableFile,_std::nullptr_t> file2;
  Own<const_kj::File,_std::nullptr_t> file;
  ssize_t n;
  Own<kj::Directory,_std::nullptr_t> dir;
  StringPtr local_50;
  TestClock clock;
  
  clock.super_Clock._vptr_Clock = (_func_int **)&PTR_now_005887b0;
  clock.time.value.value = (Quantity<long,_kj::_::NanosecondLabel>)1000000000;
  fileFactory = memfdInMemoryFileFactory();
  newInMemoryDirectory((kj *)&dir,&clock.super_Clock,fileFactory);
  pDVar3 = dir.ptr;
  f.exception = (Exception *)0x423c58;
  parts.size_ = 2;
  parts.ptr = (StringPtr *)&f;
  Path::Path((Path *)&local_b8,parts);
  path.parts.size_ = (size_t)local_b8.ptr;
  path.parts.ptr = (String *)pDVar3;
  Directory::openFile((Directory *)&file,path,(WriteMode)local_b8.size_);
  Array<kj::String>::~Array(&local_b8);
  (**((file.ptr)->super_ReadableFile).super_FsNode._vptr_FsNode)(&f);
  if ((char)f.exception != '\x01') {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x31a,FAILED,"file->getFd() != nullptr","");
    kj::_::Debug::Fault::fatal(&f);
  }
  __fd = f.exception._4_4_;
  do {
    n = ::write(__fd,"foo",3);
    if (-1 < n) goto LAB_0025c270;
    osErrorNumber = kj::_::Debug::getOsErrorNumber(false);
  } while (osErrorNumber == -1);
  if (osErrorNumber != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x31c,osErrorNumber,"n = write(fd, \"foo\", 3)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_0025c270:
  f.exception = (Exception *)&n;
  if ((n != 3) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[24],kj::_::DebugComparison<long&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x31d,ERROR,"\"failed: expected \" \"n == 3\", _kjCondition",
               (char (*) [24])"failed: expected n == 3",(DebugComparison<long_&,_int> *)&f);
  }
  ReadableFile::readAllText((String *)&_kjCondition_4,&(file.ptr)->super_ReadableFile);
  local_b8.ptr = (String *)_kjCondition_4.left;
  local_b8.size_ = _kjCondition_4.right;
  local_b8.disposer = (ArrayDisposer *)_kjCondition_4.op.content.ptr;
  _kjCondition_4.left = 0;
  _kjCondition_4.right = 0;
  file2.disposer = (Disposer *)0x423c58;
  file2.ptr = (ReadableFile *)&DAT_00000004;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_kj::StringPtr> *)&f,
             (DebugExpression<kj::String> *)&local_b8,(StringPtr *)&file2);
  Array<char>::~Array((Array<char> *)&local_b8);
  Array<char>::~Array((Array<char> *)&_kjCondition_4);
  if ((local_f0 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<kj::String,kj::StringPtr>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,799,ERROR,
               "\"failed: expected \" \"file->readAllText() == \\\"foo\\\"_kj\", _kjCondition",
               (char (*) [49])"failed: expected file->readAllText() == \"foo\"_kj",
               (DebugComparison<kj::String,_kj::StringPtr> *)&f);
  }
  Array<char>::~Array((Array<char> *)&f);
  pDVar3 = dir.ptr;
  f.exception = (Exception *)0x423c58;
  parts_00.size_ = 2;
  parts_00.ptr = (StringPtr *)&f;
  Path::Path((Path *)&local_b8,parts_00);
  path_00.parts.size_ = (size_t)local_b8.ptr;
  path_00.parts.ptr = (String *)pDVar3;
  ReadableDirectory::openFile((ReadableDirectory *)&file2,path_00);
  Array<kj::String>::~Array(&local_b8);
  ReadableFile::readAllText((String *)&_kjCondition_4,file2.ptr);
  local_b8.ptr = (String *)_kjCondition_4.left;
  local_b8.size_ = _kjCondition_4.right;
  local_b8.disposer = (ArrayDisposer *)_kjCondition_4.op.content.ptr;
  _kjCondition_4.left = 0;
  _kjCondition_4.right = 0;
  local_50.content.ptr = "foo";
  local_50.content.size_ = 4;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_kj::StringPtr> *)&f,
             (DebugExpression<kj::String> *)&local_b8,&local_50);
  Array<char>::~Array((Array<char> *)&local_b8);
  Array<char>::~Array((Array<char> *)&_kjCondition_4);
  if ((local_f0 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[50],kj::_::DebugComparison<kj::String,kj::StringPtr>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x323,ERROR,
               "\"failed: expected \" \"file2->readAllText() == \\\"foo\\\"_kj\", _kjCondition",
               (char (*) [50])"failed: expected file2->readAllText() == \"foo\"_kj",
               (DebugComparison<kj::String,_kj::StringPtr> *)&f);
  }
  Array<char>::~Array((Array<char> *)&f);
  text.content.size_ = 4;
  text.content.ptr = "bar";
  File::writeAll(file.ptr,text);
  ReadableFile::readAllText((String *)&_kjCondition_4,file2.ptr);
  local_b8.ptr = (String *)_kjCondition_4.left;
  local_b8.size_ = _kjCondition_4.right;
  local_b8.disposer = (ArrayDisposer *)_kjCondition_4.op.content.ptr;
  _kjCondition_4.left = 0;
  _kjCondition_4.right = 0;
  local_50.content.ptr = "bar";
  local_50.content.size_ = 4;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_kj::StringPtr> *)&f,
             (DebugExpression<kj::String> *)&local_b8,&local_50);
  Array<char>::~Array((Array<char> *)&local_b8);
  Array<char>::~Array((Array<char> *)&_kjCondition_4);
  if ((local_f0 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[50],kj::_::DebugComparison<kj::String,kj::StringPtr>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x325,ERROR,
               "\"failed: expected \" \"file2->readAllText() == \\\"bar\\\"_kj\", _kjCondition",
               (char (*) [50])"failed: expected file2->readAllText() == \"bar\"_kj",
               (DebugComparison<kj::String,_kj::StringPtr> *)&f);
  }
  Array<char>::~Array((Array<char> *)&f);
  (**((file2.ptr)->super_FsNode)._vptr_FsNode)(&local_b8);
  if ((char)local_b8.ptr == '\x01') {
    f.exception._4_4_ = local_b8.ptr._4_4_;
  }
  f.exception._0_1_ = (char)local_b8.ptr;
  if (((char)local_b8.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<kj::Maybe<int>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x326,ERROR,"\"failed: expected \" \"file2->getFd() != kj::none\", _kjCondition",
               (char (*) [44])"failed: expected file2->getFd() != kj::none",
               (DebugComparison<kj::Maybe<int>,_const_kj::None_&> *)&f);
  }
  (*((file.ptr)->super_ReadableFile).super_FsNode._vptr_FsNode[2])(&f);
  (*((file2.ptr)->super_FsNode)._vptr_FsNode[2])(&local_b8);
  _kjCondition_4.left = (unsigned_long)local_100;
  _kjCondition_4.right = (unsigned_long)local_90;
  _kjCondition_4.op.content.ptr = " == ";
  _kjCondition_4.op.content.size_ = 5;
  _kjCondition_4.result = local_100 == local_90;
  if ((!_kjCondition_4.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[65],kj::_::DebugComparison<unsigned_long,unsigned_long>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x327,ERROR,
               "\"failed: expected \" \"file->stat().hashCode == file2->stat().hashCode\", _kjCondition"
               ,(char (*) [65])"failed: expected file->stat().hashCode == file2->stat().hashCode",
               &_kjCondition_4);
  }
  (*((dir.ptr)->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xf])(&local_b8);
  (*(code *)**(undefined8 **)local_b8.size_)(&_kjCondition_4);
  cVar1 = (char)_kjCondition_4.left;
  if ((char)_kjCondition_4.left == '\x01') {
    uVar2 = _kjCondition_4.left._4_4_;
    _kjCondition_4.left = _kjCondition_4.left & 0xffffffffffffff00;
    f.exception._4_4_ = uVar2;
  }
  f.exception._0_1_ = cVar1;
  Own<const_kj::File,_std::nullptr_t>::dispose((Own<const_kj::File,_std::nullptr_t> *)&local_b8);
  if ((cVar1 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<int>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x329,ERROR,
               "\"failed: expected \" \"dir->createTemporary()->getFd() != kj::none\", _kjCondition"
               ,(char (*) [61])"failed: expected dir->createTemporary()->getFd() != kj::none",
               (DebugComparison<kj::Maybe<int>,_const_kj::None_&> *)&f);
  }
  Own<const_kj::ReadableFile,_std::nullptr_t>::dispose(&file2);
  Own<const_kj::File,_std::nullptr_t>::dispose(&file);
  Own<kj::Directory,_std::nullptr_t>::dispose(&dir);
  return;
}

Assistant:

void tick() {
    time += 1 * SECONDS;
  }